

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O3

void __thiscall aiMesh::~aiMesh(aiMesh *this)

{
  aiBone *paVar1;
  aiAnimMesh *this_00;
  aiFace *paVar2;
  void *pvVar3;
  uint a;
  long lVar4;
  uint a_2;
  ulong uVar5;
  
  if (this->mVertices != (aiVector3D *)0x0) {
    operator_delete__(this->mVertices);
  }
  if (this->mNormals != (aiVector3D *)0x0) {
    operator_delete__(this->mNormals);
  }
  if (this->mTangents != (aiVector3D *)0x0) {
    operator_delete__(this->mTangents);
  }
  if (this->mBitangents != (aiVector3D *)0x0) {
    operator_delete__(this->mBitangents);
  }
  lVar4 = 0;
  do {
    if (this->mTextureCoords[lVar4] != (aiVector3D *)0x0) {
      operator_delete__(this->mTextureCoords[lVar4]);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  lVar4 = 0;
  do {
    if (this->mColors[lVar4] != (aiColor4D *)0x0) {
      operator_delete__(this->mColors[lVar4]);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  if ((this->mNumBones != 0) && (this->mBones != (aiBone **)0x0)) {
    uVar5 = 0;
    do {
      paVar1 = this->mBones[uVar5];
      if ((paVar1 != (aiBone *)0x0) && (paVar1->mWeights != (aiVertexWeight *)0x0)) {
        operator_delete__(paVar1->mWeights);
      }
      operator_delete(paVar1);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->mNumBones);
    if (this->mBones != (aiBone **)0x0) {
      operator_delete__(this->mBones);
    }
  }
  if ((this->mNumAnimMeshes != 0) && (this->mAnimMeshes != (aiAnimMesh **)0x0)) {
    uVar5 = 0;
    do {
      this_00 = this->mAnimMeshes[uVar5];
      if (this_00 != (aiAnimMesh *)0x0) {
        aiAnimMesh::~aiAnimMesh(this_00);
      }
      operator_delete(this_00);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->mNumAnimMeshes);
    if (this->mAnimMeshes != (aiAnimMesh **)0x0) {
      operator_delete__(this->mAnimMeshes);
    }
  }
  paVar2 = this->mFaces;
  if (paVar2 != (aiFace *)0x0) {
    if (paVar2[-1].mIndices != (uint *)0x0) {
      lVar4 = (long)paVar2[-1].mIndices << 4;
      do {
        pvVar3 = *(void **)((long)&paVar2[-1].mIndices + lVar4);
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
        lVar4 = lVar4 + -0x10;
      } while (lVar4 != 0);
    }
    operator_delete__(&paVar2[-1].mIndices);
    return;
  }
  return;
}

Assistant:

~aiMesh() {
        delete [] mVertices;
        delete [] mNormals;
        delete [] mTangents;
        delete [] mBitangents;
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; a++) {
            delete [] mTextureCoords[a];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; a++) {
            delete [] mColors[a];
        }

        // DO NOT REMOVE THIS ADDITIONAL CHECK
        if (mNumBones && mBones)    {
            for( unsigned int a = 0; a < mNumBones; a++) {
                delete mBones[a];
            }
            delete [] mBones;
        }

        if (mNumAnimMeshes && mAnimMeshes)  {
            for( unsigned int a = 0; a < mNumAnimMeshes; a++) {
                delete mAnimMeshes[a];
            }
            delete [] mAnimMeshes;
        }

        delete [] mFaces;
    }